

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

int rsa1_loadpub_f(Filename *filename,BinarySink *bs,char **commentptr,char **errorstr)

{
  LoadedFile *lf_00;
  int toret;
  LoadedFile *lf;
  char **errorstr_local;
  char **commentptr_local;
  BinarySink *bs_local;
  Filename *filename_local;
  
  lf_00 = lf_load_keyfile(filename,errorstr);
  if (lf_00 == (LoadedFile *)0x0) {
    filename_local._4_4_ = 0;
  }
  else {
    filename_local._4_4_ = rsa1_loadpub_s(lf_00->binarysource_,bs,commentptr,errorstr);
    lf_free(lf_00);
  }
  return filename_local._4_4_;
}

Assistant:

int rsa1_loadpub_f(const Filename *filename, BinarySink *bs,
                   char **commentptr, const char **errorstr)
{
    LoadedFile *lf = lf_load_keyfile(filename, errorstr);
    if (!lf)
        return 0;

    int toret = rsa1_loadpub_s(BinarySource_UPCAST(lf), bs,
                               commentptr, errorstr);
    lf_free(lf);
    return toret;
}